

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlAttrPtr xmlHasProp(xmlNode *node,xmlChar *name)

{
  _xmlDoc *p_Var1;
  bool bVar2;
  int iVar3;
  xmlAttributePtr pxVar4;
  xmlAttrPtr pxVar5;
  
  if (node == (xmlNode *)0x0) {
    return (xmlAttrPtr)0x0;
  }
  if (name == (xmlChar *)0x0) {
    return (xmlAttrPtr)0x0;
  }
  if (node->type != XML_ELEMENT_NODE) {
    return (xmlAttrPtr)0x0;
  }
  for (pxVar5 = node->properties; pxVar5 != (xmlAttrPtr)0x0; pxVar5 = pxVar5->next) {
    iVar3 = xmlStrEqual(pxVar5->name,name);
    if (iVar3 != 0) {
      return pxVar5;
    }
  }
  p_Var1 = node->doc;
  if (p_Var1 == (_xmlDoc *)0x0) {
    return (xmlAttrPtr)0x0;
  }
  pxVar4 = (xmlAttributePtr)0x0;
  if (p_Var1->intSubset != (xmlDtdPtr)0x0) {
    pxVar4 = xmlGetDtdAttrDesc(p_Var1->intSubset,node->name,name);
    if (pxVar4 == (xmlAttributePtr)0x0) {
      if (p_Var1->extSubset == (xmlDtdPtr)0x0) {
        pxVar4 = (xmlAttributePtr)0x0;
      }
      else {
        pxVar4 = xmlGetDtdAttrDesc(p_Var1->extSubset,node->name,name);
      }
    }
    if ((pxVar4 != (xmlAttributePtr)0x0) && (pxVar4->defaultValue != (xmlChar *)0x0)) {
      bVar2 = false;
      goto LAB_0014ec7b;
    }
  }
  bVar2 = true;
LAB_0014ec7b:
  if (bVar2) {
    return (xmlAttrPtr)0x0;
  }
  return (xmlAttrPtr)pxVar4;
}

Assistant:

xmlAttrPtr
xmlHasProp(const xmlNode *node, const xmlChar *name) {
    xmlAttrPtr prop;
    xmlDocPtr doc;

    if ((node == NULL) || (node->type != XML_ELEMENT_NODE) || (name == NULL))
        return(NULL);
    /*
     * Check on the properties attached to the node
     */
    prop = node->properties;
    while (prop != NULL) {
        if (xmlStrEqual(prop->name, name))  {
	    return(prop);
        }
	prop = prop->next;
    }

    /*
     * Check if there is a default declaration in the internal
     * or external subsets
     */
    doc =  node->doc;
    if (doc != NULL) {
        xmlAttributePtr attrDecl;
        if (doc->intSubset != NULL) {
	    attrDecl = xmlGetDtdAttrDesc(doc->intSubset, node->name, name);
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdAttrDesc(doc->extSubset, node->name, name);
            if ((attrDecl != NULL) && (attrDecl->defaultValue != NULL))
              /* return attribute declaration only if a default value is given
                 (that includes #FIXED declarations) */
		return((xmlAttrPtr) attrDecl);
	}
    }
    return(NULL);
}